

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O2

string * __thiscall
cmSourceFile::GetObjectLibrary_abi_cxx11_(string *__return_storage_ptr__,cmSourceFile *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->ObjectLibrary);
  return __return_storage_ptr__;
}

Assistant:

std::string cmSourceFile::GetObjectLibrary() const
{
  return this->ObjectLibrary;
}